

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestMixedFieldsAndExtensions::ByteSizeLong(TestMixedFieldsAndExtensions *this)

{
  int size;
  int32_t value;
  size_t sVar1;
  long lVar2;
  uint32_t *puVar3;
  long local_78;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMixedFieldsAndExtensions *this_;
  TestMixedFieldsAndExtensions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  size = _internal_b_size(this);
  sVar1 = google::protobuf::internal::FromIntSize(size);
  lVar2 = sVar1 * 4;
  if (lVar2 == 0) {
    local_78 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar2);
    local_78 = sVar1 + 1;
  }
  sStack_58 = local_78 + lVar2 + sStack_58;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar3 & 1) != 0) {
    value = _internal_a(this);
    sVar1 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
    sStack_58 = sVar1 + sStack_58;
  }
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestMixedFieldsAndExtensions::ByteSizeLong() const {
  const TestMixedFieldsAndExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated fixed32 b = 3;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_b_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 1 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
  }
   {
    // int32 a = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_a());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}